

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

int Abc_NtkPrintSubraphSizes(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar4;
  int local_1c;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                  ,0x767,"int Abc_NtkPrintSubraphSizes(Abc_Ntk_t *)");
  }
  for (local_1c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    pObj_00 = Abc_NtkObj(pNtk,local_1c);
    if ((((pObj_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0)) &&
        (iVar1 = Abc_ObjFanoutNum(pObj_00), 1 < iVar1)) &&
       (iVar1 = Abc_NodeIsExorType(pObj_00), iVar1 == 0)) {
      pAVar4 = Abc_ObjFanin0(pObj_00);
      iVar1 = Abc_ObjSugraphSize(pAVar4);
      pAVar4 = Abc_ObjFanin1(pObj_00);
      iVar2 = Abc_ObjSugraphSize(pAVar4);
      uVar3 = Abc_ObjFanoutNum(pObj_00);
      printf("%d(%d) ",(ulong)(uint)(iVar1 + 1 + iVar2),(ulong)uVar3);
    }
  }
  printf("\n");
  return 1;
}

Assistant:

int Abc_NtkPrintSubraphSizes( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( Abc_ObjFanoutNum(pObj) > 1 && !Abc_NodeIsExorType(pObj) )
            printf( "%d(%d) ", 1 + Abc_ObjSugraphSize(Abc_ObjFanin0(pObj)) + 
                Abc_ObjSugraphSize(Abc_ObjFanin1(pObj)), Abc_ObjFanoutNum(pObj) );
    printf( "\n" );
    return 1;
}